

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O0

_Bool los(chunk_conflict *c,loc grid1,loc grid2)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  loc_conflict lVar6;
  int local_b4;
  int local_b0;
  wchar_t m;
  wchar_t f2;
  wchar_t f1;
  wchar_t ty;
  wchar_t tx;
  wchar_t qy;
  wchar_t qx;
  wchar_t sy;
  wchar_t sx;
  wchar_t ay;
  wchar_t ax;
  wchar_t dy;
  wchar_t dx;
  chunk_conflict *c_local;
  wchar_t wStack_18;
  loc grid2_local;
  loc grid1_local;
  
  wStack_18 = grid2.y;
  grid2_local.y = grid1.y;
  iVar2 = wStack_18 - grid2_local.y;
  c_local._4_4_ = grid2.x;
  grid2_local.x = grid1.x;
  iVar3 = c_local._4_4_ - grid2_local.x;
  local_b0 = iVar2;
  if (iVar2 < 0) {
    local_b0 = -iVar2;
  }
  local_b4 = iVar3;
  if (iVar3 < 0) {
    local_b4 = -iVar3;
  }
  if ((local_b4 < 2) && (local_b0 < 2)) {
    grid1_local.x._3_1_ = true;
  }
  else if (iVar3 == 0) {
    if (iVar2 < 1) {
      do {
        f2 = grid2_local.y + L'\xffffffff';
        if (f2 <= wStack_18) {
          return true;
        }
        lVar6 = (loc_conflict)loc(grid2_local.x,f2);
        _Var1 = square_isprojectable((chunk *)c,lVar6);
        grid2_local.y = f2;
      } while (_Var1);
      grid1_local.x._3_1_ = false;
    }
    else {
      do {
        f2 = grid2_local.y + L'\x01';
        if (wStack_18 <= f2) {
          return true;
        }
        lVar6 = (loc_conflict)loc(grid2_local.x,f2);
        _Var1 = square_isprojectable((chunk *)c,lVar6);
        grid2_local.y = f2;
      } while (_Var1);
      grid1_local.x._3_1_ = false;
    }
  }
  else if (iVar2 == 0) {
    if (iVar3 < 1) {
      do {
        f1 = grid2_local.x + L'\xffffffff';
        if (f1 <= c_local._4_4_) {
          return true;
        }
        lVar6 = (loc_conflict)loc(f1,grid2_local.y);
        _Var1 = square_isprojectable((chunk *)c,lVar6);
        grid2_local.x = f1;
      } while (_Var1);
      grid1_local.x._3_1_ = false;
    }
    else {
      do {
        f1 = grid2_local.x + L'\x01';
        if (c_local._4_4_ <= f1) {
          return true;
        }
        lVar6 = (loc_conflict)loc(f1,grid2_local.y);
        _Var1 = square_isprojectable((chunk *)c,lVar6);
        grid2_local.x = f1;
      } while (_Var1);
      grid1_local.x._3_1_ = false;
    }
  }
  else {
    iVar4 = 1;
    if (iVar3 < 0) {
      iVar4 = -1;
    }
    iVar3 = 1;
    if (iVar2 < 0) {
      iVar3 = -1;
    }
    if ((local_b4 == 1) && (local_b0 == 2)) {
      lVar6 = (loc_conflict)loc(grid2_local.x,grid2_local.y + iVar3);
      _Var1 = square_isprojectable((chunk *)c,lVar6);
      if (_Var1) {
        return true;
      }
    }
    if ((local_b0 == 1) && (local_b4 == 2)) {
      lVar6 = (loc_conflict)loc(grid2_local.x + iVar4,grid2_local.y);
      _Var1 = square_isprojectable((chunk *)c,lVar6);
      if (_Var1) {
        return true;
      }
    }
    wVar5 = local_b4 * local_b0;
    if (local_b4 < local_b0) {
      tx = local_b4 * local_b4;
      iVar2 = tx * 2;
      if (tx == wVar5) {
        f1 = grid2_local.x + iVar4;
        tx = tx + wVar5 * -2;
      }
      else {
        f1 = grid2_local.x;
      }
      while (f2 = grid2_local.y + iVar3, wStack_18 != f2) {
        lVar6 = (loc_conflict)loc(f1,f2);
        _Var1 = square_isprojectable((chunk *)c,lVar6);
        if (!_Var1) {
          return false;
        }
        tx = iVar2 + tx;
        grid2_local.y = f2;
        if (wVar5 <= tx) {
          if (wVar5 < tx) {
            lVar6 = (loc_conflict)loc(iVar4 + f1,f2);
            _Var1 = square_isprojectable((chunk *)c,lVar6);
            if (!_Var1) {
              return false;
            }
          }
          tx = tx + wVar5 * -2;
          f1 = iVar4 + f1;
        }
      }
    }
    else {
      ty = local_b0 * local_b0;
      iVar2 = ty * 2;
      if (ty == wVar5) {
        f2 = grid2_local.y + iVar3;
        ty = ty + wVar5 * -2;
      }
      else {
        f2 = grid2_local.y;
      }
      while (f1 = grid2_local.x + iVar4, c_local._4_4_ != f1) {
        lVar6 = (loc_conflict)loc(f1,f2);
        _Var1 = square_isprojectable((chunk *)c,lVar6);
        if (!_Var1) {
          return false;
        }
        ty = iVar2 + ty;
        grid2_local.x = f1;
        if (wVar5 <= ty) {
          if (wVar5 < ty) {
            lVar6 = (loc_conflict)loc(f1,iVar3 + f2);
            _Var1 = square_isprojectable((chunk *)c,lVar6);
            if (!_Var1) {
              return false;
            }
          }
          ty = ty + wVar5 * -2;
          f2 = iVar3 + f2;
        }
      }
    }
    grid1_local.x._3_1_ = true;
  }
  return grid1_local.x._3_1_;
}

Assistant:

bool los(struct chunk *c, struct loc grid1, struct loc grid2)
{
	/* Delta */
	int dx, dy;

	/* Absolute */
	int ax, ay;

	/* Signs */
	int sx, sy;

	/* Fractions */
	int qx, qy;

	/* Scanners */
	int tx, ty;

	/* Scale factors */
	int f1, f2;

	/* Slope, or 1/Slope, of LOS */
	int m;

	/* Extract the offset */
	dy = grid2.y - grid1.y;
	dx = grid2.x - grid1.x;

	/* Extract the absolute offset */
	ay = ABS(dy);
	ax = ABS(dx);

	/* Handle adjacent (or identical) grids */
	if ((ax < 2) && (ay < 2)) return (true);

	/* Directly South/North */
	if (!dx) {
		/* South -- check for walls */
		if (dy > 0) {
			for (ty = grid1.y + 1; ty < grid2.y; ty++)
				if (!square_isprojectable(c, loc(grid1.x, ty))) return (false);
		} else { /* North -- check for walls */
			for (ty = grid1.y - 1; ty > grid2.y; ty--)
				if (!square_isprojectable(c, loc(grid1.x, ty))) return (false);
		}

		/* Assume los */
		return (true);
	}

	/* Directly East/West */
	if (!dy) {
		/* East -- check for walls */
		if (dx > 0) {
			for (tx = grid1.x + 1; tx < grid2.x; tx++)
				if (!square_isprojectable(c, loc(tx, grid1.y))) return (false);
		} else { /* West -- check for walls */
			for (tx = grid1.x - 1; tx > grid2.x; tx--)
				if (!square_isprojectable(c, loc(tx, grid1.y))) return (false);
		}

		/* Assume los */
		return (true);
	}


	/* Extract some signs */
	sx = (dx < 0) ? -1 : 1;
	sy = (dy < 0) ? -1 : 1;

	/* Vertical and horizontal "knights" */
	if ((ax == 1) && (ay == 2) &&
		square_isprojectable(c, loc(grid1.x, grid1.y + sy))) {
		return (true);
	} else if ((ay == 1) && (ax == 2) &&
			   square_isprojectable(c, loc(grid1.x + sx, grid1.y))) {
		return (true);
	}

	/* Calculate scale factor div 2 */
	f2 = (ax * ay);

	/* Calculate scale factor */
	f1 = f2 << 1;


	/* Travel horizontally */
	if (ax >= ay) {
		/* Let m = dy / dx * 2 * (dy * dx) = 2 * dy * dy */
		qy = ay * ay;
		m = qy << 1;

		tx = grid1.x + sx;

		/* Consider the special case where slope == 1. */
		if (qy == f2) {
			ty = grid1.y + sy;
			qy -= f1;
		} else {
			ty = grid1.y;
		}

		/* Note (below) the case (qy == f2), where */
		/* the LOS exactly meets the corner of a tile. */
		while (grid2.x - tx) {
			if (!square_isprojectable(c, loc(tx, ty)))
				return (false);

			qy += m;

			if (qy < f2) {
				tx += sx;
			} else if (qy > f2) {
				ty += sy;
				if (!square_isprojectable(c, loc(tx, ty)))
					return (false);
				qy -= f1;
				tx += sx;
			} else {
				ty += sy;
				qy -= f1;
				tx += sx;
			}
		}
	} else { /* Travel vertically */
		/* Let m = dx / dy * 2 * (dx * dy) = 2 * dx * dx */
		qx = ax * ax;
		m = qx << 1;

		ty = grid1.y + sy;

		if (qx == f2) {
			tx = grid1.x + sx;
			qx -= f1;
		} else {
			tx = grid1.x;
		}

		/* Note (below) the case (qx == f2), where */
		/* the LOS exactly meets the corner of a tile. */
		while (grid2.y - ty) {
			if (!square_isprojectable(c, loc(tx, ty)))
				return (false);

			qx += m;

			if (qx < f2) {
				ty += sy;
			} else if (qx > f2) {
				tx += sx;
				if (!square_isprojectable(c, loc(tx, ty)))
					return (false);
				qx -= f1;
				ty += sy;
			} else {
				tx += sx;
				qx -= f1;
				ty += sy;
			}
		}
	}

	/* Assume los */
	return (true);
}